

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *args_2;
  SyntaxNode *args_3;
  InstanceConfigRuleSyntax *pIVar1;
  DeepCloneVisitor visitor;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::ConfigInstanceIdentifierSyntax>
                     ((SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *)(__fn + 0x38),
                      (BumpAllocator *)__child_stack);
  args_3 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x70),(DeepCloneVisitor *)&local_60,
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::InstanceConfigRuleSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax>&,slang::syntax::ConfigRuleClauseSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_50,&local_40,args_2,
                      (ConfigRuleClauseSyntax *)args_3,&local_60);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const InstanceConfigRuleSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<InstanceConfigRuleSyntax>(
        node.instance.deepClone(alloc),
        node.topModule.deepClone(alloc),
        *deepClone(node.instanceNames, alloc),
        *deepClone<ConfigRuleClauseSyntax>(*node.ruleClause, alloc),
        node.semi.deepClone(alloc)
    );
}